

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

bool __thiscall QDateTimeEdit::event(QDateTimeEdit *this,QEvent *event)

{
  ColorGroup *pCVar1;
  undefined1 uVar2;
  short sVar3;
  QWidgetPrivate *this_00;
  QArrayData *pQVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  sVar3 = *(short *)(event + 8);
  if (sVar3 == 100) {
    QWidgetPrivate::setLayoutItemMargins(this_00,SE_DateTimeEditLayoutItem,(QStyleOption *)0x0);
  }
  else if (sVar3 == 0x58) {
    (**(code **)(*(long *)this_00 + 0xc0))(this_00);
  }
  else if (sVar3 == 0x25) {
    uVar2 = this_00[2].field_0x49;
    local_48.d.d = *(Data **)&this_00[1].data.pal.currentGroup;
    local_48.d.ptr = *(char16_t **)&this_00[1].data.fnt;
    local_48.d.size = *(qsizetype *)&this_00[1].data.field_0x40;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (*(long *)&this_00[1].data.fnt != 0) {
      pCVar1 = &this_00[1].data.pal.currentGroup;
      pQVar4 = *(QArrayData **)pCVar1;
      *(undefined8 *)pCVar1 = 0;
      *(undefined8 *)&this_00[1].data.fnt = 0;
      *(undefined8 *)&this_00[1].data.field_0x40 = 0;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    setDisplayFormat(this,&local_48);
    this_00[2].field_0x49 = uVar2;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar5 = QAbstractSpinBox::event((QAbstractSpinBox *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QDateTimeEdit::event(QEvent *event)
{
    Q_D(QDateTimeEdit);
    switch (event->type()) {
    case QEvent::ApplicationLayoutDirectionChange: {
        const bool was = d->formatExplicitlySet;
        const QString oldFormat = d->displayFormat;
        d->displayFormat.clear();
        setDisplayFormat(oldFormat);
        d->formatExplicitlySet = was;
        break; }
    case QEvent::LocaleChange:
        d->updateEdit();
        break;
    case QEvent::StyleChange:
#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
#endif
        d->setLayoutItemMargins(QStyle::SE_DateTimeEditLayoutItem);
        break;
    default:
        break;
    }
    return QAbstractSpinBox::event(event);
}